

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.cpp
# Opt level: O0

void __thiscall
GenericCommandWrapperIRCCommand::trigger
          (GenericCommandWrapperIRCCommand *this,IRC_Bot *source,string_view in_channel,
          string_view in_nick,string_view in_parameters)

{
  string *psVar1;
  __sv_type _Var2;
  size_t local_b8;
  char *local_b0;
  size_t local_98;
  char *local_90;
  size_t local_78;
  char *local_70;
  string *local_48;
  ResponseLine *result;
  ResponseLine *del;
  IRC_Bot *source_local;
  GenericCommandWrapperIRCCommand *this_local;
  string_view in_nick_local;
  string_view in_channel_local;
  
  psVar1 = (string *)
           (**(code **)(*(long *)this->m_command + 0x18))
                     (this->m_command,in_parameters._M_len,in_parameters._M_str);
  while (local_48 = psVar1, local_48 != (string *)0x0) {
    switch(*(undefined4 *)(local_48 + 0x20)) {
    case 0:
    case 2:
      _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(local_48);
      local_78 = _Var2._M_len;
      local_70 = _Var2._M_str;
      Jupiter::IRC::Client::sendMessage
                (source,in_channel._M_len,in_channel._M_str,local_78,local_70);
      break;
    case 1:
    case 3:
      _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(local_48);
      local_98 = _Var2._M_len;
      local_90 = _Var2._M_str;
      Jupiter::IRC::Client::sendNotice(source,in_nick._M_len,in_nick._M_str,local_98,local_90);
      break;
    default:
      _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(local_48);
      local_b8 = _Var2._M_len;
      local_b0 = _Var2._M_str;
      Jupiter::IRC::Client::sendMessage(source,in_nick._M_len,in_nick._M_str,local_b8,local_b0);
    }
    psVar1 = *(string **)(local_48 + 0x28);
    if (local_48 != (string *)0x0) {
      Jupiter::GenericCommand::ResponseLine::~ResponseLine((ResponseLine *)local_48);
      operator_delete(local_48,0x30);
    }
  }
  return;
}

Assistant:

void GenericCommandWrapperIRCCommand::trigger(IRC_Bot *source, std::string_view in_channel, std::string_view in_nick, std::string_view in_parameters) {
	Jupiter::GenericCommand::ResponseLine *del;
	Jupiter::GenericCommand::ResponseLine *result = m_command->trigger(in_parameters);

	while (result != nullptr)
	{
		switch (result->type)
		{
		case Jupiter::GenericCommand::DisplayType::PublicSuccess:
		case Jupiter::GenericCommand::DisplayType::PublicError:
			source->sendMessage(in_channel, result->response);
			break;
		case Jupiter::GenericCommand::DisplayType::PrivateSuccess:
		case Jupiter::GenericCommand::DisplayType::PrivateError:
			source->sendNotice(in_nick, result->response);
			break;
		default:
			source->sendMessage(in_nick, result->response);
			break;
		}

		del = result;
		result = result->next;
		delete del;
	}
}